

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.cpp
# Opt level: O2

int __thiscall ncnn::Cast::forward(Cast *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int _w;
  int _h;
  uint _c;
  void *pvVar1;
  void *pvVar2;
  unsigned_short uVar3;
  int i_2;
  int iVar4;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  int i;
  size_t _elemsize;
  ulong uVar9;
  uint uVar10;
  float fVar11;
  int local_90;
  Mat local_70;
  
  if (this->type_from == this->type_to) {
    Mat::operator=(top_blob,bottom_blob);
    local_90 = 0;
  }
  else {
    iVar4 = bottom_blob->dims;
    iVar5 = bottom_blob->elempack;
    _elemsize = (size_t)iVar5;
    switch(this->type_to) {
    case 1:
      _elemsize = _elemsize * 4;
      break;
    case 2:
    case 4:
      _elemsize = (size_t)(iVar5 * 2);
      break;
    case 3:
      break;
    default:
      _elemsize = bottom_blob->elemsize;
    }
    _w = bottom_blob->w;
    _h = bottom_blob->h;
    _c = bottom_blob->c;
    if (iVar4 == 3) {
      Mat::create(top_blob,_w,_h,_c,_elemsize,iVar5,opt->blob_allocator);
    }
    else if (iVar4 == 2) {
      Mat::create(top_blob,_w,_h,_elemsize,iVar5,opt->blob_allocator);
    }
    else if (iVar4 == 1) {
      Mat::create(top_blob,_w,_elemsize,iVar5,opt->blob_allocator);
    }
    local_90 = -100;
    if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
      uVar10 = _h * _w * iVar5;
      iVar4 = this->type_from;
      iVar5 = this->type_to;
      if (iVar5 == 2 && iVar4 == 1) {
        uVar8 = 0;
        uVar7 = 0;
        if (0 < (int)uVar10) {
          uVar7 = (ulong)uVar10;
        }
        uVar6 = 0;
        if (0 < (int)_c) {
          uVar6 = _c;
        }
        for (; uVar8 != uVar6; uVar8 = uVar8 + 1) {
          Mat::channel(&local_70,bottom_blob,uVar8);
          pvVar1 = local_70.data;
          Mat::~Mat(&local_70);
          Mat::channel(&local_70,top_blob,uVar8);
          pvVar2 = local_70.data;
          Mat::~Mat(&local_70);
          for (uVar9 = 0; uVar7 != uVar9; uVar9 = uVar9 + 1) {
            uVar3 = float32_to_float16(*(float *)((long)pvVar1 + uVar9 * 4));
            *(unsigned_short *)((long)pvVar2 + uVar9 * 2) = uVar3;
          }
        }
        iVar4 = this->type_from;
        iVar5 = this->type_to;
      }
      if (iVar5 == 1 && iVar4 == 2) {
        uVar8 = 0;
        uVar7 = 0;
        if (0 < (int)uVar10) {
          uVar7 = (ulong)uVar10;
        }
        uVar6 = 0;
        if (0 < (int)_c) {
          uVar6 = _c;
        }
        for (; uVar8 != uVar6; uVar8 = uVar8 + 1) {
          Mat::channel(&local_70,bottom_blob,uVar8);
          pvVar1 = local_70.data;
          Mat::~Mat(&local_70);
          Mat::channel(&local_70,top_blob,uVar8);
          pvVar2 = local_70.data;
          Mat::~Mat(&local_70);
          for (uVar9 = 0; uVar7 != uVar9; uVar9 = uVar9 + 1) {
            fVar11 = float16_to_float32(*(unsigned_short *)((long)pvVar1 + uVar9 * 2));
            *(float *)((long)pvVar2 + uVar9 * 4) = fVar11;
          }
        }
        iVar4 = this->type_from;
        iVar5 = this->type_to;
      }
      if ((iVar4 == 3) && (iVar5 == 1)) {
        uVar8 = 0;
        uVar7 = 0;
        if (0 < (int)uVar10) {
          uVar7 = (ulong)uVar10;
        }
        uVar6 = 0;
        if (0 < (int)_c) {
          uVar6 = _c;
        }
        for (; uVar8 != uVar6; uVar8 = uVar8 + 1) {
          Mat::channel(&local_70,bottom_blob,uVar8);
          pvVar1 = local_70.data;
          Mat::~Mat(&local_70);
          Mat::channel(&local_70,top_blob,uVar8);
          pvVar2 = local_70.data;
          Mat::~Mat(&local_70);
          for (uVar9 = 0; uVar7 != uVar9; uVar9 = uVar9 + 1) {
            *(float *)((long)pvVar2 + uVar9 * 4) = (float)(int)*(char *)((long)pvVar1 + uVar9);
          }
        }
        iVar4 = this->type_from;
        iVar5 = this->type_to;
      }
      if ((iVar4 == 1) && (iVar5 == 4)) {
        uVar8 = 0;
        uVar7 = 0;
        if (0 < (int)uVar10) {
          uVar7 = (ulong)uVar10;
        }
        uVar6 = 0;
        if (0 < (int)_c) {
          uVar6 = _c;
        }
        for (; uVar8 != uVar6; uVar8 = uVar8 + 1) {
          Mat::channel(&local_70,bottom_blob,uVar8);
          pvVar1 = local_70.data;
          Mat::~Mat(&local_70);
          Mat::channel(&local_70,top_blob,uVar8);
          pvVar2 = local_70.data;
          Mat::~Mat(&local_70);
          for (uVar9 = 0; uVar7 != uVar9; uVar9 = uVar9 + 1) {
            *(undefined2 *)((long)pvVar2 + uVar9 * 2) =
                 *(undefined2 *)((long)pvVar1 + uVar9 * 4 + 2);
          }
        }
        iVar4 = this->type_from;
        iVar5 = this->type_to;
      }
      local_90 = 0;
      if ((iVar4 == 4) && (iVar5 == 1)) {
        if ((int)uVar10 < 1) {
          uVar10 = 0;
        }
        local_90 = 0;
        if ((int)_c < 1) {
          _c = 0;
        }
        for (uVar8 = 0; uVar8 != _c; uVar8 = uVar8 + 1) {
          Mat::channel(&local_70,bottom_blob,uVar8);
          pvVar1 = local_70.data;
          Mat::~Mat(&local_70);
          Mat::channel(&local_70,top_blob,uVar8);
          pvVar2 = local_70.data;
          Mat::~Mat(&local_70);
          for (uVar7 = 0; uVar10 != uVar7; uVar7 = uVar7 + 1) {
            *(uint *)((long)pvVar2 + uVar7 * 4) =
                 (uint)*(ushort *)((long)pvVar1 + uVar7 * 2) << 0x10;
          }
        }
      }
    }
  }
  return local_90;
}

Assistant:

int Cast::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    if (type_from == type_to)
    {
        top_blob = bottom_blob;
        return 0;
    }

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    size_t out_elemsize = elemsize;
    if (type_to == 1)
    {
        // float32
        out_elemsize = 4 * elempack;
    }
    else if (type_to == 2)
    {
        // float16
        out_elemsize = 2 * elempack;
    }
    else if (type_to == 3)
    {
        // int8
        out_elemsize = elempack;
    }
    else if (type_to == 4)
    {
        // bfloat16
        out_elemsize = 2 * elempack;
    }

    if (dims == 1)
    {
        top_blob.create(w, out_elemsize, elempack, opt.blob_allocator);
    }
    else if (dims == 2)
    {
        top_blob.create(w, h, out_elemsize, elempack, opt.blob_allocator);
    }
    else if (dims == 3)
    {
        top_blob.create(w, h, channels, out_elemsize, elempack, opt.blob_allocator);
    }
    if (top_blob.empty())
        return -100;

    int size = w * h * elempack;

    if (type_from == 1 && type_to == 2)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            const float* ptr = bottom_blob.channel(q);
            unsigned short* outptr = top_blob.channel(q);

            for (int i=0; i<size; i++)
            {
                outptr[i] = float32_to_float16(ptr[i]);
            }
        }
    }

    if (type_from == 2 && type_to == 1)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            const unsigned short* ptr = bottom_blob.channel(q);
            float* outptr = top_blob.channel(q);

            for (int i=0; i<size; i++)
            {
                outptr[i] = float16_to_float32(ptr[i]);
            }
        }
    }

    if (type_from == 3 && type_to == 1)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            const signed char* ptr = bottom_blob.channel(q);
            float* outptr = top_blob.channel(q);

            for (int i=0; i<size; i++)
            {
                outptr[i] = (float)ptr[i];
            }
        }
    }

    if (type_from == 1 && type_to == 4)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            const float* ptr = bottom_blob.channel(q);
            unsigned short* outptr = top_blob.channel(q);

            for (int i=0; i<size; i++)
            {
                outptr[i] = float32_to_bfloat16(ptr[i]);
            }
        }
    }

    if (type_from == 4 && type_to == 1)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            const unsigned short* ptr = bottom_blob.channel(q);
            float* outptr = top_blob.channel(q);

            for (int i=0; i<size; i++)
            {
                outptr[i] = bfloat16_to_float32(ptr[i]);
            }
        }
    }

    // TODO more cast type

    return 0;
}